

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O3

void TemplateCacheUnittest::TestExpandNoLoad(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  char cVar4;
  int iVar5;
  string out;
  string top_filename;
  TemplateCache cache;
  TemplateDictionary dict;
  string filename;
  string inc_filename;
  pointer local_1a8;
  size_type sStack_1a0;
  undefined1 local_198;
  undefined8 local_190;
  TemplateString local_188;
  string local_168;
  TemplateString local_148 [2];
  string local_108 [3];
  string local_98;
  string local_78;
  char *local_58;
  undefined8 uStack_50;
  undefined1 local_48;
  undefined7 uStack_47;
  undefined8 uStack_40;
  pointer local_38;
  size_type sStack_30;
  undefined1 local_28;
  uint7 uStack_27;
  undefined8 uStack_20;
  
  ctemplate::TemplateCache::TemplateCache((TemplateCache *)local_148);
  paVar1 = &local_108[0].field_2;
  local_108[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"alone","");
  ctemplate::StringToTemplateFile(&local_98,local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_108[0]._M_dataplus._M_p);
  }
  local_108[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Hello, {{>WORLD}}","");
  ctemplate::StringToTemplateFile(&local_168,local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_108[0]._M_dataplus._M_p);
  }
  local_108[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"world","");
  ctemplate::StringToTemplateFile(&local_78,local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_108[0]._M_dataplus._M_p);
  }
  local_188.ptr_ = "ExpandNoLoad";
  local_188.length_ = 0xc;
  local_188.is_immutable_ = true;
  local_188.id_ = 0;
  ctemplate::TemplateDictionary::TemplateDictionary
            ((TemplateDictionary *)local_108,&local_188,(UnsafeArena *)0x0);
  local_58 = "WORLD";
  uStack_50 = 5;
  local_48 = 1;
  uStack_40 = 0;
  TVar2._17_7_ = uStack_47;
  TVar2.is_immutable_ = true;
  TVar2.length_ = 5;
  TVar2.ptr_ = "WORLD";
  TVar2.id_ = 0;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar2);
  local_38 = local_78._M_dataplus._M_p;
  sStack_30 = local_78._M_string_length;
  local_28 = 0;
  uStack_20 = 0;
  TVar3.length_ = local_78._M_string_length;
  TVar3.ptr_ = local_78._M_dataplus._M_p;
  TVar3._16_8_ = (ulong)uStack_27 << 8;
  TVar3.id_ = 0;
  ctemplate::TemplateDictionary::SetFilename(TVar3);
  local_188.length_ = 0;
  local_188.is_immutable_ = false;
  local_188.ptr_ = &local_188.is_immutable_;
  ctemplate::TemplateCache::Freeze();
  local_1a8 = local_98._M_dataplus._M_p;
  sStack_1a0 = local_98._M_string_length;
  local_198 = 0;
  local_190 = 0;
  cVar4 = ctemplate::TemplateCache::ExpandNoLoad
                    (local_148,(Strip)&local_1a8,(TemplateDictionaryInterface *)0x0,
                     (PerExpandData *)local_108,(ExpandEmitter *)0x0);
  if (cVar4 == '\0') {
    ctemplate::TemplateCache::ClearCache();
    local_1a8 = local_98._M_dataplus._M_p;
    sStack_1a0 = local_98._M_string_length;
    local_198 = 0;
    local_190 = 0;
    cVar4 = ctemplate::TemplateCache::ExpandWithData
                      (local_148,(Strip)&local_1a8,(TemplateDictionaryInterface *)0x0,
                       (PerExpandData *)local_108,(ExpandEmitter *)0x0);
    if (cVar4 == '\0') {
      printf("ASSERT FAILED, line %d: %s\n",0xd0,
             "cache.ExpandWithData(filename, DO_NOT_STRIP, &dict, NULL, &out)");
      local_1a8 = local_98._M_dataplus._M_p;
      sStack_1a0 = local_98._M_string_length;
      local_198 = 0;
      local_190 = 0;
      cVar4 = ctemplate::TemplateCache::ExpandWithData
                        (local_148,(Strip)&local_1a8,(TemplateDictionaryInterface *)0x0,
                         (PerExpandData *)local_108,(ExpandEmitter *)0x0);
      if (cVar4 == '\0') {
        __assert_fail("cache.ExpandWithData(filename, DO_NOT_STRIP, &dict, __null, &out)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                      ,0xd0,"static void TemplateCacheUnittest::TestExpandNoLoad()");
      }
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)&local_188);
      if (iVar5 == 0) {
        local_188.length_ = 0;
        *local_188.ptr_ = false;
        ctemplate::TemplateCache::Freeze();
        local_1a8 = local_98._M_dataplus._M_p;
        sStack_1a0 = local_98._M_string_length;
        local_198 = 0;
        local_190 = 0;
        cVar4 = ctemplate::TemplateCache::ExpandNoLoad
                          (local_148,(Strip)&local_1a8,(TemplateDictionaryInterface *)0x0,
                           (PerExpandData *)local_108,(ExpandEmitter *)0x0);
        if (cVar4 == '\0') {
          printf("ASSERT FAILED, line %d: %s\n",0xd5,
                 "cache.ExpandNoLoad(filename, DO_NOT_STRIP, &dict, NULL, &out)");
          local_1a8 = local_98._M_dataplus._M_p;
          sStack_1a0 = local_98._M_string_length;
          local_198 = 0;
          local_190 = 0;
          cVar4 = ctemplate::TemplateCache::ExpandNoLoad
                            (local_148,(Strip)&local_1a8,(TemplateDictionaryInterface *)0x0,
                             (PerExpandData *)local_108,(ExpandEmitter *)0x0);
          if (cVar4 == '\0') {
            __assert_fail("cache.ExpandNoLoad(filename, DO_NOT_STRIP, &dict, __null, &out)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                          ,0xd5,"static void TemplateCacheUnittest::TestExpandNoLoad()");
          }
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)&local_188);
          if (iVar5 == 0) {
            local_188.length_ = 0;
            *local_188.ptr_ = false;
            ctemplate::TemplateCache::ClearCache();
            ctemplate::TemplateCache::Freeze();
            local_1a8 = local_168._M_dataplus._M_p;
            sStack_1a0 = local_168._M_string_length;
            local_198 = 0;
            local_190 = 0;
            cVar4 = ctemplate::TemplateCache::ExpandNoLoad
                              (local_148,(Strip)&local_1a8,(TemplateDictionaryInterface *)0x0,
                               (PerExpandData *)local_108,(ExpandEmitter *)0x0);
            if (cVar4 == '\0') {
              ctemplate::TemplateCache::ClearCache();
              local_1a8 = local_168._M_dataplus._M_p;
              sStack_1a0 = local_168._M_string_length;
              local_198 = 0;
              local_190 = 0;
              cVar4 = ctemplate::TemplateCache::LoadTemplate(local_148,(Strip)&local_1a8);
              if (cVar4 == '\0') {
                printf("ASSERT FAILED, line %d: %s\n",0xde,
                       "cache.LoadTemplate(top_filename, DO_NOT_STRIP)");
                local_1a8 = local_168._M_dataplus._M_p;
                sStack_1a0 = local_168._M_string_length;
                local_198 = 0;
                local_190 = 0;
                cVar4 = ctemplate::TemplateCache::LoadTemplate(local_148,(Strip)&local_1a8);
                if (cVar4 == '\0') {
                  __assert_fail("cache.LoadTemplate(top_filename, DO_NOT_STRIP)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                ,0xde,"static void TemplateCacheUnittest::TestExpandNoLoad()");
                }
              }
              else {
                ctemplate::TemplateCache::Freeze();
                local_1a8 = local_168._M_dataplus._M_p;
                sStack_1a0 = local_168._M_string_length;
                local_198 = 0;
                local_190 = 0;
                cVar4 = ctemplate::TemplateCache::ExpandNoLoad
                                  (local_148,(Strip)&local_1a8,(TemplateDictionaryInterface *)0x0,
                                   (PerExpandData *)local_108,(ExpandEmitter *)0x0);
                if (cVar4 == '\0') {
                  local_188.length_ = 0;
                  *local_188.ptr_ = false;
                  ctemplate::TemplateCache::ClearCache();
                  local_1a8 = local_168._M_dataplus._M_p;
                  sStack_1a0 = local_168._M_string_length;
                  local_198 = 0;
                  local_190 = 0;
                  cVar4 = ctemplate::TemplateCache::LoadTemplate(local_148,(Strip)&local_1a8);
                  if (cVar4 == '\0') {
                    printf("ASSERT FAILED, line %d: %s\n",0xe6,
                           "cache.LoadTemplate(top_filename, DO_NOT_STRIP)");
                    local_1a8 = local_168._M_dataplus._M_p;
                    sStack_1a0 = local_168._M_string_length;
                    local_198 = 0;
                    local_190 = 0;
                    cVar4 = ctemplate::TemplateCache::LoadTemplate(local_148,(Strip)&local_1a8);
                    if (cVar4 == '\0') {
                      __assert_fail("cache.LoadTemplate(top_filename, DO_NOT_STRIP)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                    ,0xe6,"static void TemplateCacheUnittest::TestExpandNoLoad()");
                    }
                  }
                  else {
                    local_1a8 = local_78._M_dataplus._M_p;
                    sStack_1a0 = local_78._M_string_length;
                    local_198 = 0;
                    local_190 = 0;
                    cVar4 = ctemplate::TemplateCache::LoadTemplate(local_148,(Strip)&local_1a8);
                    if (cVar4 == '\0') {
                      printf("ASSERT FAILED, line %d: %s\n",0xe7,
                             "cache.LoadTemplate(inc_filename, DO_NOT_STRIP)");
                      local_1a8 = local_78._M_dataplus._M_p;
                      sStack_1a0 = local_78._M_string_length;
                      local_198 = 0;
                      local_190 = 0;
                      cVar4 = ctemplate::TemplateCache::LoadTemplate(local_148,(Strip)&local_1a8);
                      if (cVar4 == '\0') {
                        __assert_fail("cache.LoadTemplate(inc_filename, DO_NOT_STRIP)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                      ,0xe7,"static void TemplateCacheUnittest::TestExpandNoLoad()")
                        ;
                      }
                    }
                    else {
                      ctemplate::TemplateCache::Freeze();
                      local_1a8 = local_168._M_dataplus._M_p;
                      sStack_1a0 = local_168._M_string_length;
                      local_198 = 0;
                      local_190 = 0;
                      cVar4 = ctemplate::TemplateCache::ExpandNoLoad
                                        (local_148,(Strip)&local_1a8,
                                         (TemplateDictionaryInterface *)0x0,
                                         (PerExpandData *)local_108,(ExpandEmitter *)0x0);
                      if (cVar4 == '\0') {
                        printf("ASSERT FAILED, line %d: %s\n",0xea,
                               "cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out)");
                        local_1a8 = local_168._M_dataplus._M_p;
                        sStack_1a0 = local_168._M_string_length;
                        local_198 = 0;
                        local_190 = 0;
                        cVar4 = ctemplate::TemplateCache::ExpandNoLoad
                                          (local_148,(Strip)&local_1a8,
                                           (TemplateDictionaryInterface *)0x0,
                                           (PerExpandData *)local_108,(ExpandEmitter *)0x0);
                        if (cVar4 == '\0') {
                          __assert_fail("cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, __null, &out)"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                        ,0xea,
                                        "static void TemplateCacheUnittest::TestExpandNoLoad()");
                        }
                      }
                      else {
                        iVar5 = std::__cxx11::string::compare((char *)&local_188);
                        if (iVar5 == 0) {
                          local_188.length_ = 0;
                          *local_188.ptr_ = false;
                          local_1a8 = local_168._M_dataplus._M_p;
                          sStack_1a0 = local_168._M_string_length;
                          local_198 = 0;
                          local_190 = 0;
                          cVar4 = ctemplate::TemplateCache::ExpandWithData
                                            (local_148,(Strip)&local_1a8,
                                             (TemplateDictionaryInterface *)0x0,
                                             (PerExpandData *)local_108,(ExpandEmitter *)0x0);
                          if (cVar4 == '\0') {
                            printf("ASSERT FAILED, line %d: %s\n",0xee,
                                   "cache.ExpandWithData(top_filename, DO_NOT_STRIP, &dict, NULL, &out)"
                                  );
                            local_1a8 = local_168._M_dataplus._M_p;
                            sStack_1a0 = local_168._M_string_length;
                            local_198 = 0;
                            local_190 = 0;
                            cVar4 = ctemplate::TemplateCache::ExpandWithData
                                              (local_148,(Strip)&local_1a8,
                                               (TemplateDictionaryInterface *)0x0,
                                               (PerExpandData *)local_108,(ExpandEmitter *)0x0);
                            if (cVar4 == '\0') {
                              __assert_fail("cache.ExpandWithData(top_filename, DO_NOT_STRIP, &dict, __null, &out)"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                            ,0xee,
                                            "static void TemplateCacheUnittest::TestExpandNoLoad()")
                              ;
                            }
                          }
                          else {
                            iVar5 = std::__cxx11::string::compare((char *)&local_188);
                            if (iVar5 == 0) {
                              local_188.length_ = 0;
                              *local_188.ptr_ = false;
                              ctemplate::TemplateCache::ClearCache();
                              local_1a8 = local_168._M_dataplus._M_p;
                              sStack_1a0 = local_168._M_string_length;
                              local_198 = 0;
                              local_190 = 0;
                              cVar4 = ctemplate::TemplateCache::ExpandWithData
                                                (local_148,(Strip)&local_1a8,
                                                 (TemplateDictionaryInterface *)0x0,
                                                 (PerExpandData *)local_108,(ExpandEmitter *)0x0);
                              if (cVar4 == '\0') {
                                printf("ASSERT FAILED, line %d: %s\n",0xf3,
                                       "cache.ExpandWithData(top_filename, DO_NOT_STRIP, &dict, NULL, &out)"
                                      );
                                local_1a8 = local_168._M_dataplus._M_p;
                                sStack_1a0 = local_168._M_string_length;
                                local_198 = 0;
                                local_190 = 0;
                                cVar4 = ctemplate::TemplateCache::ExpandWithData
                                                  (local_148,(Strip)&local_1a8,
                                                   (TemplateDictionaryInterface *)0x0,
                                                   (PerExpandData *)local_108,(ExpandEmitter *)0x0);
                                if (cVar4 == '\0') {
                                  __assert_fail("cache.ExpandWithData(top_filename, DO_NOT_STRIP, &dict, __null, &out)"
                                                ,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                                ,0xf3,
                                                "static void TemplateCacheUnittest::TestExpandNoLoad()"
                                               );
                                }
                              }
                              else {
                                iVar5 = std::__cxx11::string::compare((char *)&local_188);
                                if (iVar5 == 0) {
                                  local_188.length_ = 0;
                                  *local_188.ptr_ = false;
                                  ctemplate::TemplateCache::Freeze();
                                  local_1a8 = local_168._M_dataplus._M_p;
                                  sStack_1a0 = local_168._M_string_length;
                                  local_198 = 0;
                                  local_190 = 0;
                                  cVar4 = ctemplate::TemplateCache::ExpandNoLoad
                                                    (local_148,(Strip)&local_1a8,
                                                     (TemplateDictionaryInterface *)0x0,
                                                     (PerExpandData *)local_108,(ExpandEmitter *)0x0
                                                    );
                                  if (cVar4 == '\0') {
                                    printf("ASSERT FAILED, line %d: %s\n",0xf8,
                                           "cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out)"
                                          );
                                    local_1a8 = local_168._M_dataplus._M_p;
                                    sStack_1a0 = local_168._M_string_length;
                                    local_198 = 0;
                                    local_190 = 0;
                                    cVar4 = ctemplate::TemplateCache::ExpandNoLoad
                                                      (local_148,(Strip)&local_1a8,
                                                       (TemplateDictionaryInterface *)0x0,
                                                       (PerExpandData *)local_108,
                                                       (ExpandEmitter *)0x0);
                                    if (cVar4 == '\0') {
                                      __assert_fail(
                                                  "cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, __null, &out)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                                  ,0xf8,
                                                  "static void TemplateCacheUnittest::TestExpandNoLoad()"
                                                  );
                                    }
                                  }
                                  else {
                                    iVar5 = std::__cxx11::string::compare((char *)&local_188);
                                    if (iVar5 == 0) {
                                      local_188.length_ = 0;
                                      *local_188.ptr_ = false;
                                      ctemplate::TemplateCache::ClearCache();
                                      local_1a8 = local_168._M_dataplus._M_p;
                                      sStack_1a0 = local_168._M_string_length;
                                      local_198 = 0;
                                      local_190 = 0;
                                      cVar4 = ctemplate::TemplateCache::LoadTemplate
                                                        (local_148,(Strip)&local_1a8);
                                      if (cVar4 == '\0') {
                                        printf("ASSERT FAILED, line %d: %s\n",0xfd,
                                               "cache.LoadTemplate(top_filename, DO_NOT_STRIP)");
                                        local_1a8 = local_168._M_dataplus._M_p;
                                        sStack_1a0 = local_168._M_string_length;
                                        local_198 = 0;
                                        local_190 = 0;
                                        cVar4 = ctemplate::TemplateCache::LoadTemplate
                                                          (local_148,(Strip)&local_1a8);
                                        if (cVar4 == '\0') {
                                          __assert_fail(
                                                  "cache.LoadTemplate(top_filename, DO_NOT_STRIP)",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                                  ,0xfd,
                                                  "static void TemplateCacheUnittest::TestExpandNoLoad()"
                                                  );
                                        }
                                      }
                                      else {
                                        ctemplate::TemplateCache::Freeze();
                                        local_1a8 = local_78._M_dataplus._M_p;
                                        sStack_1a0 = local_78._M_string_length;
                                        local_198 = 0;
                                        local_190 = 0;
                                        cVar4 = ctemplate::TemplateCache::LoadTemplate
                                                          (local_148,(Strip)&local_1a8);
                                        if (cVar4 == '\0') {
                                          local_1a8 = local_168._M_dataplus._M_p;
                                          sStack_1a0 = local_168._M_string_length;
                                          local_198 = 0;
                                          local_190 = 0;
                                          cVar4 = ctemplate::TemplateCache::ExpandNoLoad
                                                            (local_148,(Strip)&local_1a8,
                                                             (TemplateDictionaryInterface *)0x0,
                                                             (PerExpandData *)local_108,
                                                             (ExpandEmitter *)0x0);
                                          if (cVar4 == '\0') {
                                            if ((bool *)local_188.ptr_ != &local_188.is_immutable_)
                                            {
                                              operator_delete(local_188.ptr_);
                                            }
                                            ctemplate::TemplateDictionary::~TemplateDictionary
                                                      ((TemplateDictionary *)local_108);
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
                                              operator_delete(local_78._M_dataplus._M_p);
                                            }
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_168._M_dataplus._M_p != &local_168.field_2)
                                            {
                                              operator_delete(local_168._M_dataplus._M_p);
                                            }
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
                                              operator_delete(local_98._M_dataplus._M_p);
                                            }
                                            ctemplate::TemplateCache::~TemplateCache
                                                      ((TemplateCache *)local_148);
                                            return;
                                          }
                                          printf("ASSERT FAILED, line %d: %s\n",0x102,
                                                 "!cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out)"
                                                );
                                          local_1a8 = local_168._M_dataplus._M_p;
                                          sStack_1a0 = local_168._M_string_length;
                                          local_198 = 0;
                                          local_190 = 0;
                                          cVar4 = ctemplate::TemplateCache::ExpandNoLoad
                                                            (local_148,(Strip)&local_1a8,
                                                             (TemplateDictionaryInterface *)0x0,
                                                             (PerExpandData *)local_108,
                                                             (ExpandEmitter *)0x0);
                                          if (cVar4 != '\0') {
                                            __assert_fail(
                                                  "!cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, __null, &out)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                                  ,0x102,
                                                  "static void TemplateCacheUnittest::TestExpandNoLoad()"
                                                  );
                                          }
                                        }
                                        else {
                                          printf("ASSERT FAILED, line %d: %s\n",0x100,
                                                 "!cache.LoadTemplate(inc_filename, DO_NOT_STRIP)");
                                          local_1a8 = local_78._M_dataplus._M_p;
                                          sStack_1a0 = local_78._M_string_length;
                                          local_198 = 0;
                                          local_190 = 0;
                                          cVar4 = ctemplate::TemplateCache::LoadTemplate
                                                            (local_148,(Strip)&local_1a8);
                                          if (cVar4 != '\0') {
                                            __assert_fail(
                                                  "!cache.LoadTemplate(inc_filename, DO_NOT_STRIP)",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                                  ,0x100,
                                                  "static void TemplateCacheUnittest::TestExpandNoLoad()"
                                                  );
                                          }
                                        }
                                      }
                                    }
                                    else {
                                      printf("ASSERT FAILED, line %d: %s\n",0xf9,
                                             "out == \"Hello, world\"");
                                      iVar5 = std::__cxx11::string::compare((char *)&local_188);
                                      if (iVar5 != 0) {
                                        __assert_fail("out == \"Hello, world\"",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                                  ,0xf9,
                                                  "static void TemplateCacheUnittest::TestExpandNoLoad()"
                                                  );
                                      }
                                    }
                                  }
                                }
                                else {
                                  printf("ASSERT FAILED, line %d: %s\n",0xf4,
                                         "out == \"Hello, world\"");
                                  iVar5 = std::__cxx11::string::compare((char *)&local_188);
                                  if (iVar5 != 0) {
                                    __assert_fail("out == \"Hello, world\"",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                                  ,0xf4,
                                                  "static void TemplateCacheUnittest::TestExpandNoLoad()"
                                                 );
                                  }
                                }
                              }
                            }
                            else {
                              printf("ASSERT FAILED, line %d: %s\n",0xef,"out == \"Hello, world\"");
                              iVar5 = std::__cxx11::string::compare((char *)&local_188);
                              if (iVar5 != 0) {
                                __assert_fail("out == \"Hello, world\"",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                              ,0xef,
                                              "static void TemplateCacheUnittest::TestExpandNoLoad()"
                                             );
                              }
                            }
                          }
                        }
                        else {
                          printf("ASSERT FAILED, line %d: %s\n",0xeb,"out == \"Hello, world\"");
                          iVar5 = std::__cxx11::string::compare((char *)&local_188);
                          if (iVar5 != 0) {
                            __assert_fail("out == \"Hello, world\"",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                          ,0xeb,
                                          "static void TemplateCacheUnittest::TestExpandNoLoad()");
                          }
                        }
                      }
                    }
                  }
                }
                else {
                  printf("ASSERT FAILED, line %d: %s\n",0xe1,
                         "!cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out)");
                  local_1a8 = local_168._M_dataplus._M_p;
                  sStack_1a0 = local_168._M_string_length;
                  local_198 = 0;
                  local_190 = 0;
                  cVar4 = ctemplate::TemplateCache::ExpandNoLoad
                                    (local_148,(Strip)&local_1a8,(TemplateDictionaryInterface *)0x0,
                                     (PerExpandData *)local_108,(ExpandEmitter *)0x0);
                  if (cVar4 != '\0') {
                    __assert_fail("!cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, __null, &out)"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                                  ,0xe1,"static void TemplateCacheUnittest::TestExpandNoLoad()");
                  }
                }
              }
            }
            else {
              printf("ASSERT FAILED, line %d: %s\n",0xdc,
                     "!cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out)");
              local_1a8 = local_168._M_dataplus._M_p;
              sStack_1a0 = local_168._M_string_length;
              local_198 = 0;
              local_190 = 0;
              cVar4 = ctemplate::TemplateCache::ExpandNoLoad
                                (local_148,(Strip)&local_1a8,(TemplateDictionaryInterface *)0x0,
                                 (PerExpandData *)local_108,(ExpandEmitter *)0x0);
              if (cVar4 != '\0') {
                __assert_fail("!cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, __null, &out)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                              ,0xdc,"static void TemplateCacheUnittest::TestExpandNoLoad()");
              }
            }
          }
          else {
            printf("ASSERT FAILED, line %d: %s\n",0xd6,"out == \"alone\"");
            iVar5 = std::__cxx11::string::compare((char *)&local_188);
            if (iVar5 != 0) {
              __assert_fail("out == \"alone\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                            ,0xd6,"static void TemplateCacheUnittest::TestExpandNoLoad()");
            }
          }
        }
      }
      else {
        printf("ASSERT FAILED, line %d: %s\n",0xd1,"out == \"alone\"");
        iVar5 = std::__cxx11::string::compare((char *)&local_188);
        if (iVar5 != 0) {
          __assert_fail("out == \"alone\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                        ,0xd1,"static void TemplateCacheUnittest::TestExpandNoLoad()");
        }
      }
    }
  }
  else {
    printf("ASSERT FAILED, line %d: %s\n",0xcc,
           "!cache.ExpandNoLoad(filename, DO_NOT_STRIP, &dict, NULL, &out)");
    local_1a8 = local_98._M_dataplus._M_p;
    sStack_1a0 = local_98._M_string_length;
    local_198 = 0;
    local_190 = 0;
    cVar4 = ctemplate::TemplateCache::ExpandNoLoad
                      (local_148,(Strip)&local_1a8,(TemplateDictionaryInterface *)0x0,
                       (PerExpandData *)local_108,(ExpandEmitter *)0x0);
    if (cVar4 != '\0') {
      __assert_fail("!cache.ExpandNoLoad(filename, DO_NOT_STRIP, &dict, __null, &out)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0xcc,"static void TemplateCacheUnittest::TestExpandNoLoad()");
    }
  }
  exit(1);
}

Assistant:

static void TestExpandNoLoad() {
    TemplateCache cache;
    string filename = StringToTemplateFile("alone");
    string top_filename = StringToTemplateFile("Hello, {{>WORLD}}");
    string inc_filename = StringToTemplateFile("world");

    TemplateDictionary dict("ExpandNoLoad");
    dict.AddIncludeDictionary("WORLD")->SetFilename(inc_filename);
    string out;

    // This should fail because the cache is empty.
    cache.Freeze();
    ASSERT(!cache.ExpandNoLoad(filename, DO_NOT_STRIP, &dict, NULL, &out));

    cache.ClearCache();   // also clears the "frozen" state
    // This should succeed -- it loads inc_filename from disk.
    ASSERT(cache.ExpandWithData(filename, DO_NOT_STRIP, &dict, NULL, &out));
    ASSERT(out == "alone");
    out.clear();
    // Now this should succeed -- it's in the cache.
    cache.Freeze();
    ASSERT(cache.ExpandNoLoad(filename, DO_NOT_STRIP, &dict, NULL, &out));
    ASSERT(out == "alone");
    out.clear();

    // This should fail because neither top nor inc are in the cache.
    cache.ClearCache();
    cache.Freeze();
    ASSERT(!cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out));
    cache.ClearCache();
    ASSERT(cache.LoadTemplate(top_filename, DO_NOT_STRIP));
    // This *should* fail, but because inc_filename isn't in the cache.
    cache.Freeze();
    ASSERT(!cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out));
    // TODO(csilvers): this should not be necessary.  But expand writes
    //                 to its output even before it fails.
    out.clear();
    cache.ClearCache();
    ASSERT(cache.LoadTemplate(top_filename, DO_NOT_STRIP));
    ASSERT(cache.LoadTemplate(inc_filename, DO_NOT_STRIP));
    cache.Freeze();
    // *Now* it should succeed, with everything it needs loaded.
    ASSERT(cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out));
    ASSERT(out == "Hello, world");
    out.clear();
    // This should succeed too, of course.
    ASSERT(cache.ExpandWithData(top_filename, DO_NOT_STRIP, &dict, NULL, &out));
    ASSERT(out == "Hello, world");
    out.clear();

    cache.ClearCache();
    ASSERT(cache.ExpandWithData(top_filename, DO_NOT_STRIP, &dict, NULL, &out));
    ASSERT(out == "Hello, world");
    out.clear();
    // Now everything NoLoad needs should be in the cache again.
    cache.Freeze();
    ASSERT(cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out));
    ASSERT(out == "Hello, world");
    out.clear();

    cache.ClearCache();
    ASSERT(cache.LoadTemplate(top_filename, DO_NOT_STRIP));
    cache.Freeze();
    // This fails, of course, because we're frozen.
    ASSERT(!cache.LoadTemplate(inc_filename, DO_NOT_STRIP));
    // And thus, this fails too.
    ASSERT(!cache.ExpandNoLoad(top_filename, DO_NOT_STRIP, &dict, NULL, &out));
  }